

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argengine.cpp
# Opt level: O0

void __thiscall
juzzlin::Argengine::addOption
          (Argengine *this,OptionSet *optionVariants,ValuelessCallback *callback,bool required,
          string *infoText)

{
  byte bVar1;
  pointer __x;
  byte in_CL;
  Impl *in_RDX;
  function<void_()> *in_RSI;
  ValuelessCallback *in_R8;
  string *in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffd7;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar1 = in_CL & 1;
  __x = std::unique_ptr<juzzlin::Argengine::Impl,_std::default_delete<juzzlin::Argengine::Impl>_>::
        operator->((unique_ptr<juzzlin::Argengine::Impl,_std::default_delete<juzzlin::Argengine::Impl>_>
                    *)0x129788);
  std::function<void_()>::function(in_RSI,(function<void_()> *)__x);
  Impl::addOption(in_RDX,(OptionSet *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),in_R8,
                  (bool)in_stack_ffffffffffffffd7,in_stack_ffffffffffffffc8);
  std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>::~shared_ptr
            ((shared_ptr<juzzlin::Argengine::Impl::OptionDefinition> *)0x1297d5);
  std::function<void_()>::~function((function<void_()> *)0x1297df);
  return;
}

Assistant:

void Argengine::addOption(OptionSet optionVariants, ValuelessCallback callback, bool required, std::string infoText)
{
    m_impl->addOption(optionVariants, callback, required, infoText);
}